

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O2

void __thiscall
cfd::js::api::json::GetPrivkeyFromExtkeyRequest::GetPrivkeyFromExtkeyRequest
          (GetPrivkeyFromExtkeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_22;
  allocator local_21;
  
  (this->super_JsonClassBase<cfd::js::api::json::GetPrivkeyFromExtkeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__GetPrivkeyFromExtkeyRequest_00b39648;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string((string *)&this->extkey_,"",&local_21);
  std::__cxx11::string::string((string *)&this->network_,"mainnet",&local_22);
  this->wif_ = true;
  this->is_compressed_ = true;
  CollectFieldName();
  return;
}

Assistant:

GetPrivkeyFromExtkeyRequest() {
    CollectFieldName();
  }